

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  Rep *pRVar1;
  ArenaImpl *this_00;
  int iVar2;
  undefined4 extraout_var;
  MessageLite *pMVar3;
  
  pRVar1 = this->rep_;
  if (pRVar1 != (Rep *)0x0) {
    iVar2 = this->current_size_;
    if (iVar2 < pRVar1->allocated_size) {
      this->current_size_ = iVar2 + 1;
      return (MessageLite *)pRVar1->elements[iVar2];
    }
    if ((pRVar1 != (Rep *)0x0) && (pRVar1->allocated_size != this->total_size_)) goto LAB_001d48c6;
  }
  if (this->current_size_ <= this->total_size_) {
    InternalExtend(this,(this->total_size_ - this->current_size_) + 1);
  }
LAB_001d48c6:
  this->rep_->allocated_size = this->rep_->allocated_size + 1;
  this_00 = (ArenaImpl *)this->arena_;
  if (prototype == (MessageLite *)0x0) {
    if (this_00 == (ArenaImpl *)0x0) {
      pMVar3 = (MessageLite *)operator_new(0x30);
      (pMVar3->_internal_metadata_).ptr_ = (void *)0x0;
      pMVar3->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00382c98;
      pMVar3[1]._vptr_MessageLite = (_func_int **)(pMVar3 + 2);
      pMVar3[1]._internal_metadata_.ptr_ = (void *)0x0;
    }
    else {
      if ((this_00->lifecycle_id_ & 1) != 0) {
        AddWeak((RepeatedPtrFieldBase *)this_00);
      }
      pMVar3 = (MessageLite *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (this_00,0x30,
                          arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>);
      (pMVar3->_internal_metadata_).ptr_ = this_00;
      pMVar3->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00382c98;
      pMVar3[1]._vptr_MessageLite = (_func_int **)(pMVar3 + 2);
      pMVar3[1]._internal_metadata_.ptr_ = (void *)0x0;
    }
    *(undefined1 *)&pMVar3[2]._vptr_MessageLite = 0;
  }
  else {
    iVar2 = (*prototype->_vptr_MessageLite[4])(prototype,this_00);
    pMVar3 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = this->current_size_;
  this->current_size_ = iVar2 + 1;
  this->rep_->elements[iVar2] = pMVar3;
  return pMVar3;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}